

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::processRefreshSessions
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  string *__lhs;
  Session *pSVar2;
  undefined8 uVar3;
  ostream *poVar4;
  ostream *poVar5;
  TAG *pTVar6;
  HttpMessage copy;
  H2 h2;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  A a_2;
  allocator<char> local_5c1;
  string local_5c0;
  HttpMessage local_5a0;
  TAG local_550;
  TAG local_398;
  TAG local_1e0;
  
  HttpMessage::HttpMessage(&local_5a0,request);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"confirm",(allocator<char> *)&local_1e0);
  bVar1 = HttpMessage::hasParameter(&local_5a0,(string *)&local_398);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_550,"confirm",(allocator<char> *)&local_5c0);
    __lhs = HttpMessage::getParameter(&local_5a0,(string *)&local_550);
    bVar1 = std::operator!=(__lhs,"0");
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_398);
    if (bVar1) {
      Session::getSessions();
      for (uVar3 = local_398.m_tag.field_2._0_8_; (string *)uVar3 != &local_398.m_tag;
          uVar3 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar3)) {
        pSVar2 = Session::lookupSession((SessionID *)(uVar3 + 0x20));
        SessionState::refresh(&pSVar2->m_state);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_550,"confirm",(allocator<char> *)&local_1e0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&local_5a0.m_parameters._M_t,(key_type *)&local_550);
      std::__cxx11::string::~string((string *)&local_550);
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree((_Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                   *)&local_398);
      poVar5 = std::operator<<((ostream *)(h + 0x10),"<META http-equiv=\'refresh\' content=2;URL=\'"
                              );
      std::operator<<(poVar5,"/\'>");
      poVar5 = (ostream *)(b + 0x10);
      HTML::CENTER::CENTER((CENTER *)&local_398,poVar5);
      HTML::TAG::text(&local_398);
      HTML::H2::H2((H2 *)&local_550,poVar5);
      HTML::TAG::text(&local_550);
      HTML::A::A((A *)&local_1e0,poVar5);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"/",&local_5c1);
      pTVar6 = &HTML::A::href((A *)&local_1e0,&local_5c0)->super_TAG;
      HTML::TAG::text<char[9]>(pTVar6,(char (*) [9])0x1c9480);
      std::__cxx11::string::~string((string *)&local_5c0);
      HTML::TAG::~TAG(&local_1e0);
      std::operator<<(poVar5," have been refreshed");
      HTML::TAG::~TAG(&local_550);
      goto LAB_0018c6a5;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_398);
  }
  poVar5 = (ostream *)(b + 0x10);
  HTML::CENTER::CENTER((CENTER *)&local_398,poVar5);
  HTML::TAG::text(&local_398);
  HTML::H2::H2((H2 *)&local_550,poVar5);
  HTML::TAG::text(&local_550);
  std::operator<<(poVar5,"Are you sure you want to refresh all sessions ?");
  HTML::TAG::~TAG(&local_550);
  HTML::TAG::~TAG(&local_398);
  HTML::CENTER::CENTER((CENTER *)&local_398,poVar5);
  HTML::TAG::text(&local_398);
  std::operator<<(poVar5,"[");
  HTML::A::A((A *)&local_550,poVar5);
  HttpMessage::toString_abi_cxx11_(&local_5c0,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0,
                 &local_5c0,"?confirm=1");
  pTVar6 = &HTML::A::href((A *)&local_550,(string *)&local_1e0)->super_TAG;
  HTML::TAG::text<char[22]>(pTVar6,(char (*) [22])"YES, refresh sessions");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  HTML::TAG::~TAG(&local_550);
  poVar4 = std::operator<<(poVar5,"]");
  poVar4 = std::operator<<(poVar4,HTML::NBSP);
  std::operator<<(poVar4,"[");
  HTML::A::A((A *)&local_550,poVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"/",(allocator<char> *)&local_5c0);
  pTVar6 = &HTML::A::href((A *)&local_550,(string *)&local_1e0)->super_TAG;
  HTML::TAG::text<char[28]>(pTVar6,(char (*) [28])"NO, do not refresh sessions");
  std::__cxx11::string::~string((string *)&local_1e0);
  HTML::TAG::~TAG(&local_550);
  std::operator<<(poVar5,"]");
LAB_0018c6a5:
  HTML::TAG::~TAG(&local_398);
  HttpMessage::~HttpMessage(&local_5a0);
  return;
}

Assistant:

void HttpConnection::processRefreshSessions(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  try {
    HttpMessage copy = request;

    bool confirm = false;
    if (copy.hasParameter("confirm") && copy.getParameter("confirm") != "0") {
      confirm = true;
      std::set<SessionID> sessions = Session::getSessions();
      for (const SessionID &sessionID : sessions) {
        Session::lookupSession(sessionID)->refresh();
      }
      copy.removeParameter("confirm");
    }

    if (confirm) {
      h << "<META http-equiv='refresh' content=2;URL='" << "/'>";
      CENTER center(b);
      center.text();
      H2 h2(b);
      h2.text();
      {
        A a(b);
        a.href("/").text("Sessions");
      }
      b << " have been refreshed";
    } else {
      {
        CENTER center(b);
        center.text();
        H2 h2(b);
        h2.text();
        b << "Are you sure you want to refresh all sessions ?";
      }
      {
        CENTER center(b);
        center.text();
        b << "[";
        {
          A a(b);
          a.href(request.toString() + "?confirm=1").text("YES, refresh sessions");
        }
        b << "]" << NBSP << "[";
        {
          A a(b);
          a.href("/").text("NO, do not refresh sessions");
        }
        b << "]";
      }
    }
  } catch (std::exception &e) {
    b << e.what();
  }
}